

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNetlist.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkAigToLogicSopNand(Abc_Ntk_t *pNtk)

{
  long *plVar1;
  int iVar2;
  long lVar3;
  Abc_Ntk_t *pNtk_00;
  Vec_Ptr_t *pVVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pAVar6;
  Vec_Ptr_t *pVVar7;
  char *pcVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcNetlist.c"
                  ,0x1a0,"Abc_Ntk_t *Abc_NtkAigToLogicSopNand(Abc_Ntk_t *)");
  }
  iVar2 = Abc_NtkGetChoiceNum(pNtk);
  if (iVar2 != 0) {
    puts("Warning: Choice nodes are skipped.");
  }
  pVVar4 = pNtk->vObjs;
  if (0 < pVVar4->nSize) {
    lVar3 = 0;
    do {
      plVar1 = (long *)pVVar4->pArray[lVar3];
      if ((plVar1 != (long *)0x0) && (0 < *(int *)((long)plVar1 + 0x1c))) {
        uVar10 = 0;
        do {
          if ((*(uint *)(*(long *)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                  (long)*(int *)(plVar1[4] + uVar10 * 4) * 8) + 0x14) & 0xf) == 7) {
            if (1 < uVar10) goto LAB_001ea711;
            *(uint *)((long)plVar1 + 0x14) =
                 *(uint *)((long)plVar1 + 0x14) ^ (uint)(uVar10 != 0) * 0x400 + 0x400;
          }
          uVar10 = uVar10 + 1;
        } while ((long)uVar10 < (long)*(int *)((long)plVar1 + 0x1c));
      }
      lVar3 = lVar3 + 1;
      pVVar4 = pNtk->vObjs;
    } while (lVar3 < pVVar4->nSize);
  }
  pNtk_00 = Abc_NtkStartFrom(pNtk,ABC_NTK_LOGIC,ABC_FUNC_SOP);
  pVVar4 = Abc_NtkDfs(pNtk,0);
  pAVar5 = Abc_AigConst1(pNtk);
  if (0 < (pAVar5->vFanouts).nSize) {
    pAVar6 = Abc_NtkCreateNodeConst1(pNtk_00);
    (pAVar5->field_6).pCopy = pAVar6;
  }
  iVar2 = Abc_AigNodeHasComplFanoutEdgeTrav(pAVar5);
  if (iVar2 != 0) {
    pAVar6 = Abc_NtkCreateNodeInv(pNtk_00,(pAVar5->field_6).pCopy);
    (((pAVar5->field_6).pCopy)->field_6).pCopy = pAVar6;
  }
  pVVar7 = pNtk->vCis;
  if (0 < pVVar7->nSize) {
    lVar3 = 0;
    do {
      pAVar5 = (Abc_Obj_t *)pVVar7->pArray[lVar3];
      iVar2 = Abc_AigNodeHasComplFanoutEdgeTrav(pAVar5);
      if (iVar2 != 0) {
        pAVar6 = Abc_NtkCreateNodeInv(pNtk_00,(pAVar5->field_6).pCopy);
        (((pAVar5->field_6).pCopy)->field_6).pCopy = pAVar6;
      }
      lVar3 = lVar3 + 1;
      pVVar7 = pNtk->vCis;
    } while (lVar3 < pVVar7->nSize);
  }
  if (0 < pVVar4->nSize) {
    lVar3 = 0;
    do {
      pAVar5 = (Abc_Obj_t *)pVVar4->pArray[lVar3];
      Abc_NtkDupObj(pNtk_00,pAVar5,0);
      pcVar8 = Abc_SopCreateNand((Mem_Flex_t *)pNtk_00->pManFunc,2);
      (((pAVar5->field_6).pCopy)->field_5).pData = pcVar8;
      iVar2 = Abc_AigNodeHasComplFanoutEdgeTrav(pAVar5);
      if (iVar2 != 0) {
        pAVar6 = Abc_NtkCreateNodeInv(pNtk_00,(pAVar5->field_6).pCopy);
        (((pAVar5->field_6).pCopy)->field_6).pCopy = pAVar6;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < pVVar4->nSize);
  }
  if (0 < pVVar4->nSize) {
    lVar3 = 0;
    do {
      plVar1 = (long *)pVVar4->pArray[lVar3];
      if (0 < *(int *)((long)plVar1 + 0x1c)) {
        lVar11 = 0;
        do {
          lVar9 = *(long *)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                           (long)*(int *)(plVar1[4] + lVar11 * 4) * 8);
          if (lVar11 == 0) {
            iVar2 = 10;
          }
          else {
            iVar2 = 0xb;
            if (lVar11 == 2) {
              __assert_fail("i >=0 && i < 2",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abc.h"
                            ,0x17d,"int Abc_ObjFaninC(Abc_Obj_t *, int)");
            }
          }
          if ((*(uint *)((long)plVar1 + 0x14) >> iVar2 & 1) != 0) {
            lVar9 = *(long *)(lVar9 + 0x40);
          }
          Abc_ObjAddFanin((Abc_Obj_t *)plVar1[8],*(Abc_Obj_t **)(lVar9 + 0x40));
          lVar11 = lVar11 + 1;
        } while (lVar11 < *(int *)((long)plVar1 + 0x1c));
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < pVVar4->nSize);
  }
  if (pVVar4->pArray != (void **)0x0) {
    free(pVVar4->pArray);
    pVVar4->pArray = (void **)0x0;
  }
  if (pVVar4 != (Vec_Ptr_t *)0x0) {
    free(pVVar4);
  }
  pVVar4 = pNtk->vCos;
  if (0 < pVVar4->nSize) {
    lVar3 = 0;
    do {
      plVar1 = (long *)pVVar4->pArray[lVar3];
      pAVar5 = *(Abc_Obj_t **)
                (*(long *)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) + (long)*(int *)plVar1[4] * 8) +
                0x40);
      if ((*(byte *)((long)plVar1 + 0x15) & 4) != 0) {
        pAVar5 = (pAVar5->field_6).pCopy;
      }
      Abc_ObjAddFanin((Abc_Obj_t *)plVar1[8],pAVar5);
      lVar3 = lVar3 + 1;
      pVVar4 = pNtk->vCos;
    } while (lVar3 < pVVar4->nSize);
  }
  Abc_NtkLogicMakeSimpleCos(pNtk_00,0);
  pVVar4 = pNtk->vObjs;
  if (0 < pVVar4->nSize) {
    lVar3 = 0;
    do {
      plVar1 = (long *)pVVar4->pArray[lVar3];
      if ((plVar1 != (long *)0x0) && (0 < *(int *)((long)plVar1 + 0x1c))) {
        uVar10 = 0;
        do {
          if ((*(uint *)(*(long *)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                  (long)*(int *)(plVar1[4] + uVar10 * 4) * 8) + 0x14) & 0xf) == 7) {
            if (1 < uVar10) {
LAB_001ea711:
              __assert_fail("i >=0 && i < 2",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abc.h"
                            ,0x17f,"void Abc_ObjXorFaninC(Abc_Obj_t *, int)");
            }
            *(uint *)((long)plVar1 + 0x14) =
                 *(uint *)((long)plVar1 + 0x14) ^ (uint)(uVar10 != 0) * 0x400 + 0x400;
          }
          uVar10 = uVar10 + 1;
        } while ((long)uVar10 < (long)*(int *)((long)plVar1 + 0x1c));
      }
      lVar3 = lVar3 + 1;
      pVVar4 = pNtk->vObjs;
    } while (lVar3 < pVVar4->nSize);
  }
  if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
    puts("Warning: The EXDc network is skipped.");
  }
  iVar2 = Abc_NtkCheck(pNtk_00);
  if (iVar2 == 0) {
    fwrite("Abc_NtkAigToLogicSopBench(): Network check has failed.\n",0x37,1,_stdout);
  }
  return pNtk_00;
}

Assistant:

Abc_Ntk_t * Abc_NtkAigToLogicSopNand( Abc_Ntk_t * pNtk )
{
    Abc_Ntk_t * pNtkNew; 
    Abc_Obj_t * pObj, * pFanin;
    Vec_Ptr_t * vNodes;
    int i, k;
    assert( Abc_NtkIsStrash(pNtk) );
    if ( Abc_NtkGetChoiceNum(pNtk) )
        printf( "Warning: Choice nodes are skipped.\n" );
    // convert complemented edges
    Abc_NtkForEachObj( pNtk, pObj, i )
        Abc_ObjForEachFanin( pObj, pFanin, k )
            if ( Abc_ObjIsNode(pFanin) )
                Abc_ObjXorFaninC( pObj, k );
    // start the network
    pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_LOGIC, ABC_FUNC_SOP );
    // collect the nodes to be used (marks all nodes with current TravId)
    vNodes = Abc_NtkDfs( pNtk, 0 );
    // create inverters for the constant node
    pObj = Abc_AigConst1(pNtk);
    if ( Abc_ObjFanoutNum(pObj) > 0 )
        pObj->pCopy = Abc_NtkCreateNodeConst1(pNtkNew);
    if ( Abc_AigNodeHasComplFanoutEdgeTrav(pObj) )
        pObj->pCopy->pCopy = Abc_NtkCreateNodeInv( pNtkNew, pObj->pCopy );
    // create inverters for the CIs
    Abc_NtkForEachCi( pNtk, pObj, i )
        if ( Abc_AigNodeHasComplFanoutEdgeTrav(pObj) )
            pObj->pCopy->pCopy = Abc_NtkCreateNodeInv( pNtkNew, pObj->pCopy );
    // duplicate the nodes, create node functions, and inverters
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        Abc_NtkDupObj( pNtkNew, pObj, 0 );
        pObj->pCopy->pData = Abc_SopCreateNand( (Mem_Flex_t *)pNtkNew->pManFunc, 2 );
        if ( Abc_AigNodeHasComplFanoutEdgeTrav(pObj) )
            pObj->pCopy->pCopy = Abc_NtkCreateNodeInv( pNtkNew, pObj->pCopy );
    }
    // connect the objects
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        Abc_ObjForEachFanin( pObj, pFanin, k )
        {
            if ( Abc_ObjFaninC( pObj, k ) )
                Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy->pCopy );
            else
                Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );
        }